

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.c
# Opt level: O1

char * duckdb_shell_sqlite3_vsnprintf(int n,char *zBuf,char *zFormat,__va_list_tag *ap)

{
  StrAccum local_30;
  
  if (0 < n) {
    local_30.db = (void *)0x0;
    local_30.mxAlloc = 0;
    local_30.nChar = 0;
    local_30.accError = '\0';
    local_30.printfFlags = '\0';
    local_30.zText = zBuf;
    local_30.nAlloc = n;
    duckdb_shell_sqlite3VXPrintf(&local_30,zFormat,ap);
    zBuf[(ulong)local_30._20_8_ >> 0x20] = '\0';
  }
  return zBuf;
}

Assistant:

char *sqlite3_vsnprintf(int n, char *zBuf, const char *zFormat, va_list ap) {
	StrAccum acc;
	if (n <= 0)
		return zBuf;
#ifdef SQLITE_ENABLE_API_ARMOR
	if (zBuf == 0 || zFormat == 0) {
		(void)SQLITE_MISUSE_BKPT;
		if (zBuf)
			zBuf[0] = 0;
		return zBuf;
	}
#endif
	sqlite3StrAccumInit(&acc, 0, zBuf, n, 0);
	sqlite3VXPrintf(&acc, zFormat, ap);
	zBuf[acc.nChar] = 0;
	return zBuf;
}